

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_realm_book_noun(parser *p)

{
  parser_error pVar1;
  char *pcVar2;
  void *pvVar3;
  
  pcVar2 = parser_getstr(p,"book");
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar3 + 0x30));
    pcVar2 = string_make(pcVar2);
    *(char **)((long)pvVar3 + 0x30) = pcVar2;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_realm_book_noun(struct parser *p) {
	const char *book = parser_getstr(p, "book");
	struct magic_realm *realm = parser_priv(p);

	if (!realm) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(realm->book_noun);
	realm->book_noun = string_make(book);
	return PARSE_ERROR_NONE;
}